

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O1

void websocket_on_pubsub_message_direct_internal(fio_msg_s *msg,uint8_t txt)

{
  void *uuid;
  fio_write_args_s options;
  uint uVar1;
  ws_s *ws;
  size_t sVar3;
  int *piVar4;
  void *pvVar5;
  fiobj_object_vtable_s *pfVar6;
  uint uVar7;
  fio_str_info_s s;
  fio_str_info_s local_68;
  fio_str_s local_50;
  uint uVar2;
  
  ws = (ws_s *)fio_protocol_try_lock((intptr_t)msg->udata1,FIO_PR_LOCK_WRITE);
  if (ws == (ws_s *)0x0) {
    piVar4 = __errno_location();
    if (*piVar4 == 9) {
      return;
    }
    fio_message_defer(msg);
    return;
  }
  if ((ws->is_client != '\0') ||
     (pvVar5 = fio_message_metadata(msg,(ulong)txt - 0x22), pvVar5 == (void *)0x0)) {
    if (txt == '\x02') {
      txt = 0;
      local_50.ref = 0;
      local_50.small = '\0';
      local_50.frozen = '\0';
      local_50.reserved[0] = '\0';
      local_50.reserved[1] = '\0';
      local_50.reserved[2] = '\0';
      local_50.reserved[3] = '\0';
      local_50.reserved[4] = '\0';
      local_50.reserved[5] = '\0';
      local_50.reserved[6] = '\0';
      local_50.reserved[7] = '\0';
      local_50.reserved[8] = '\0';
      local_50.reserved[9] = '\0';
      local_50.capa._0_4_ = 0;
      local_50.capa._4_4_ = 0;
      local_50.len = (msg->msg).len;
      local_50.dealloc = (_func_void_void_ptr *)0x0;
      local_50.data = (msg->msg).data;
      if (local_50.len < 0x8000) {
        sVar3 = fio_str_utf8_valid(&local_50);
        txt = (uint8_t)sVar3;
      }
    }
    websocket_write(ws,msg->msg,txt & 1);
    goto LAB_0015de91;
  }
  uuid = msg->udata1;
  uVar2 = (uint)pvVar5;
  uVar1 = uVar2 & 6;
  if (uVar1 != 6 && ((ulong)pvVar5 & 1) == 0) {
    LOCK();
    piVar4 = (int *)(((ulong)pvVar5 & 0xfffffffffffffff8) + 4);
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (((ulong)pvVar5 & 1) == 0) {
    uVar7 = 0x28;
    switch(uVar1) {
    case 0:
switchD_0015dd59_caseD_0:
      uVar7 = (uint)*(byte *)((ulong)pvVar5 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_0015dd59_caseD_4:
      uVar7 = 0x2a;
      break;
    case 6:
      if ((char)pvVar5 == '&') {
        local_68.data = anon_var_dwarf_21a;
        local_68.len._0_4_ = 5;
      }
      else if ((uVar2 & 0xff) == 0x16) {
        local_68.data = anon_var_dwarf_225;
        local_68.len._0_4_ = 4;
      }
      else {
        if ((uVar2 & 0xff) != 6) {
          switch(uVar1) {
          case 0:
            goto switchD_0015dd59_caseD_0;
          case 4:
            goto switchD_0015dd59_caseD_4;
          case 6:
            uVar7 = uVar2;
          }
          break;
        }
        local_68.data = anon_var_dwarf_20f;
        local_68.len._0_4_ = 4;
      }
      local_68.capa._0_4_ = 0;
      local_68.capa._4_4_ = 0;
      local_68.len._4_4_ = 0;
      goto LAB_0015de3f;
    }
    switch(uVar7 & 0xff) {
    case 0x27:
      pfVar6 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      pfVar6 = &FIOBJECT_VTABLE_STRING;
      break;
    case 0x29:
      pfVar6 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      pfVar6 = &FIOBJECT_VTABLE_HASH;
      break;
    case 0x2b:
      pfVar6 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar6 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar6->to_str)(&local_68,(FIOBJ)pvVar5);
  }
  else {
    fio_ltocstr(&local_68,(long)pvVar5 >> 1);
  }
LAB_0015de3f:
  local_50._4_4_ = SUB84((ulong)pvVar5 >> 0x20,0);
  local_50.reserved[2] = 0xb2;
  local_50.reserved[3] = 0xde;
  local_50.reserved[4] = '\x15';
  local_50.reserved[5] = '\0';
  local_50.reserved[6] = '\0';
  local_50.reserved[7] = '\0';
  local_50.reserved[8] = '\0';
  local_50.reserved[9] = '\0';
  local_50.capa._0_4_ = (undefined4)local_68.len;
  local_50.capa._4_4_ = local_68.len._4_4_;
  local_50.len = (long)local_68.data - (long)pvVar5;
  local_50.dealloc = (_func_void_void_ptr *)((ulong)local_50.dealloc & 0xfffffffffffffff0);
  options.length._4_4_ = local_68.len._4_4_;
  options.length._0_4_ = (undefined4)local_68.len;
  options.after.dealloc = fiobj4sock_dealloc;
  options.data.buffer = pvVar5;
  options.offset = local_50.len;
  options._32_8_ = local_50.dealloc;
  local_50.ref = uVar2;
  fio_write2_fn((intptr_t)uuid,options);
LAB_0015de91:
  fio_protocol_unlock((fio_protocol_s *)ws,FIO_PR_LOCK_WRITE);
  return;
}

Assistant:

static inline void websocket_on_pubsub_message_direct_internal(fio_msg_s *msg,
                                                               uint8_t txt) {
  fio_protocol_s *pr =
      fio_protocol_try_lock((intptr_t)msg->udata1, FIO_PR_LOCK_WRITE);
  if (!pr) {
    if (errno == EBADF)
      return;
    fio_message_defer(msg);
    return;
  }
  FIOBJ message = FIOBJ_INVALID;
  FIOBJ pre_wrapped = FIOBJ_INVALID;
  if (!((ws_s *)pr)->is_client) {
    /* pre-wrapping is only for client data */
    switch (txt) {
    case 0:
      pre_wrapped =
          (FIOBJ)fio_message_metadata(msg, WEBSOCKET_OPTIMIZE_PUBSUB_BINARY);
      break;
    case 1:
      pre_wrapped =
          (FIOBJ)fio_message_metadata(msg, WEBSOCKET_OPTIMIZE_PUBSUB_TEXT);
      break;
    case 2:
      pre_wrapped = (FIOBJ)fio_message_metadata(msg, WEBSOCKET_OPTIMIZE_PUBSUB);
      break;
    default:
      break;
    }
    if (pre_wrapped) {
      // FIO_LOG_DEBUG(
      //     "pub/sub WebSocket optimization route for pre-wrapped message.");
      fiobj_send_free((intptr_t)msg->udata1, fiobj_dup(pre_wrapped));
      goto finish;
    }
  }
  if (txt == 2) {
    /* unknown text state */
    fio_str_s tmp =
        FIO_STR_INIT_STATIC2(msg->msg.data, msg->msg.len); // don't free
    txt = (tmp.len >= (2 << 14) ? 0 : fio_str_utf8_valid(&tmp));
  }
  websocket_write((ws_s *)pr, msg->msg, txt & 1);
  fiobj_free(message);
finish:
  fio_protocol_unlock(pr, FIO_PR_LOCK_WRITE);
}